

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hierarchic_fe.h
# Opt level: O0

size_type __thiscall
lf::fe::FeHierarchicTria<double>::NumEvaluationNodes(FeHierarchicTria<double> *this)

{
  size_type sVar1;
  const_reference pvVar2;
  const_reference ppQVar3;
  size_type local_34;
  size_type local_30;
  size_type local_2c;
  size_type Nt;
  size_type Ns2;
  size_type Ns1;
  size_type Ns0;
  FeHierarchicTria<double> *this_local;
  
  pvVar2 = std::array<unsigned_int,_3UL>::operator[](&this->edge_degrees_,0);
  if (*pvVar2 < 2) {
    local_2c = 0;
  }
  else {
    ppQVar3 = std::array<const_lf::quad::QuadRule_*,_3UL>::operator[](&this->qr_dual_edge_,0);
    local_2c = quad::QuadRule::NumPoints(*ppQVar3);
  }
  pvVar2 = std::array<unsigned_int,_3UL>::operator[](&this->edge_degrees_,1);
  if (*pvVar2 < 2) {
    local_30 = 0;
  }
  else {
    ppQVar3 = std::array<const_lf::quad::QuadRule_*,_3UL>::operator[](&this->qr_dual_edge_,1);
    local_30 = quad::QuadRule::NumPoints(*ppQVar3);
  }
  pvVar2 = std::array<unsigned_int,_3UL>::operator[](&this->edge_degrees_,2);
  if (*pvVar2 < 2) {
    local_34 = 0;
  }
  else {
    ppQVar3 = std::array<const_lf::quad::QuadRule_*,_3UL>::operator[](&this->qr_dual_edge_,2);
    local_34 = quad::QuadRule::NumPoints(*ppQVar3);
  }
  sVar1 = quad::QuadRule::NumPoints(this->qr_dual_tria_);
  return local_2c + 3 + local_30 + local_34 + sVar1;
}

Assistant:

[[nodiscard]] lf::base::size_type NumEvaluationNodes() const override {
    const auto Ns0 = edge_degrees_[0] > 1 ? qr_dual_edge_[0]->NumPoints() : 0;
    const auto Ns1 = edge_degrees_[1] > 1 ? qr_dual_edge_[1]->NumPoints() : 0;
    const auto Ns2 = edge_degrees_[2] > 1 ? qr_dual_edge_[2]->NumPoints() : 0;
    const lf::base::size_type Nt = qr_dual_tria_->NumPoints();
    return 3 + Ns0 + Ns1 + Ns2 + Nt;
  }